

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::setupShaderData(ShaderOperatorCase *this)

{
  uint uVar1;
  DataType DVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int precision;
  int i;
  long lVar7;
  int i_4;
  Precision PVar8;
  undefined1 *puVar9;
  int i_3;
  int i_2;
  ostringstream *poVar10;
  ShaderValue *pSVar11;
  ShaderOperatorCase *pSVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  allocator<char> local_429;
  ShaderOperatorCase *local_428;
  ShaderType local_41c;
  ShaderValue *local_418;
  float resultScale;
  undefined8 local_408;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  FloatScalar *local_3f8;
  undefined1 local_3f0 [8];
  float local_3e8;
  float local_3e4;
  ShaderValue *local_3d0;
  undefined1 local_3c8 [16];
  string local_3b8;
  Mat4 attribMatrix;
  char *inputPrecision [3];
  string prefix;
  ostringstream vtx;
  ostringstream frag;
  
  local_41c = (ShaderType)(this->super_ShaderRenderCase).m_isVertexCase;
  PVar8 = (this->m_spec).precision;
  if (PVar8 == PRECISION_LAST) {
    local_408 = (char *)0x0;
  }
  else {
    local_408 = glu::getPrecisionName(PVar8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar10 = (ostringstream *)&frag;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    poVar10 = (ostringstream *)&vtx;
  }
  local_428 = this;
  std::operator<<((ostream *)&vtx,"#version 300 es\n");
  std::operator<<((ostream *)&frag,"#version 300 es\n");
  pSVar12 = local_428;
  local_41c = local_41c ^ SHADERTYPE_FRAGMENT;
  local_3f8 = &(local_428->m_spec).resultScale;
  pSVar11 = (local_428->m_spec).inputs;
  local_3d0 = pSVar11;
  for (lVar7 = 0; lVar7 < (pSVar12->m_spec).numInputs; lVar7 = lVar7 + 1) {
    PVar8 = PRECISION_HIGHP;
    if (7 < pSVar11->type - TYPE_INT) {
      PVar8 = (pSVar12->m_spec).precision;
    }
    if (pSVar11->type - TYPE_BOOL < 4) {
      PVar8 = PRECISION_MEDIUMP;
    }
    pcVar4 = glu::getPrecisionName(PVar8);
    inputPrecision[lVar7] = pcVar4;
    pSVar11 = pSVar11 + 1;
  }
  std::operator<<((ostream *)&vtx,"in highp vec4 a_position;\n");
  for (lVar7 = 0; lVar7 < (local_428->m_spec).numInputs; lVar7 = lVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&vtx,"in ");
    poVar5 = std::operator<<(poVar5,inputPrecision[lVar7]);
    poVar5 = std::operator<<(poVar5," vec4 a_in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
    std::operator<<(poVar5,";\n");
  }
  std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n");
  if ((local_428->super_ShaderRenderCase).m_isVertexCase == false) {
    for (lVar7 = 0; lVar7 < (local_428->m_spec).numInputs; lVar7 = lVar7 + 1) {
      poVar5 = std::operator<<((ostream *)&vtx,"out ");
      pcVar4 = inputPrecision[lVar7];
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," vec4 v_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
      std::operator<<(poVar5,";\n");
      poVar5 = std::operator<<((ostream *)&frag,"in ");
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," vec4 v_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
      std::operator<<(poVar5,";\n");
    }
  }
  else {
    std::operator<<((ostream *)&vtx,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)&frag,"in mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)&vtx,"\n");
  std::operator<<((ostream *)&vtx,"void main()\n");
  std::operator<<((ostream *)&vtx,"{\n");
  std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)&frag,"\n");
  std::operator<<((ostream *)&frag,"void main()\n");
  std::operator<<((ostream *)&frag,"{\n");
  pcVar4 = "v_";
  if ((local_428->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar4 = "a_";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,pcVar4,(allocator<char> *)&attribMatrix);
  puVar9 = s_inSwizzles;
  lVar7 = 0;
  local_418 = local_3d0;
  do {
    pSVar12 = local_428;
    if ((local_428->m_spec).numInputs <= lVar7) {
      pcVar4 = glu::getDataTypeName((local_428->m_spec).output);
      DVar2 = (pSVar12->m_spec).output;
      std::operator<<((ostream *)poVar10,"\t");
      if ((local_408 != (char *)0x0) && (3 < DVar2 - TYPE_BOOL)) {
        poVar5 = std::operator<<((ostream *)poVar10,local_408);
        std::operator<<(poVar5," ");
      }
      poVar5 = std::operator<<((ostream *)poVar10,pcVar4);
      poVar5 = std::operator<<(poVar5," res = ");
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::operator<<(poVar5,"(0.0);\n\n");
      poVar5 = std::operator<<((ostream *)poVar10,"\t");
      poVar5 = std::operator<<(poVar5,(string *)&pSVar12->m_shaderOp);
      std::operator<<(poVar5,"\n\n");
      DVar2 = (pSVar12->m_spec).output;
      iVar3 = glu::getDataTypeScalarSize(DVar2);
      std::operator<<((ostream *)poVar10,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n");
      poVar5 = std::operator<<((ostream *)poVar10,"\tcolor.");
      lVar7 = (long)(iVar3 + -1);
      poVar5 = std::operator<<(poVar5,_ZN4deqp5gles310FunctionalL13s_outSwizzlesE_rel +
                                      *(int *)(_ZN4deqp5gles310FunctionalL13s_outSwizzlesE_rel +
                                              lVar7 * 4));
      std::operator<<(poVar5," = ");
      bVar13 = DVar2 - TYPE_FLOAT < 4;
      pcVar4 = "float(res)";
      if (bVar13) {
        pcVar4 = "res";
      }
      if (iVar3 != 1) {
        pcVar4 = "res";
      }
      poVar5 = (ostream *)poVar10;
      if (iVar3 != 1 && !bVar13) {
        poVar5 = std::operator<<((ostream *)poVar10,"vec");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        pcVar4 = "(res)";
      }
      std::operator<<(poVar5,pcVar4);
      std::operator<<((ostream *)poVar10,";\n");
      iVar3 = (*((pSVar12->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
      resultScale = FloatScalar::getValue
                              (local_3f8,(Functions *)CONCAT44(extraout_var,iVar3),local_41c);
      iVar3 = (*((pSVar12->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
      fVar14 = FloatScalar::getValue
                         (&(pSVar12->m_spec).resultBias,(Functions *)CONCAT44(extraout_var_00,iVar3)
                          ,local_41c);
      local_418 = (ShaderValue *)CONCAT44(local_418._4_4_,fVar14);
      if ((((fVar14 != 0.0) || (NAN(fVar14))) || (resultScale != 1.0)) || (NAN(resultScale))) {
        std::operator<<((ostream *)poVar10,"\tcolor = color");
        if ((resultScale != 1.0) || (NAN(resultScale))) {
          poVar5 = std::operator<<((ostream *)poVar10," * ");
          de::toString<float>((string *)local_3f0,&resultScale);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"1.0",&local_429);
          twoValuedVec4((string *)&attribMatrix,(string *)local_3f0,&local_3b8,
                        (BVec4 *)(s_outSwizzleChannelMasks + lVar7 * 4));
          std::operator<<(poVar5,(string *)&attribMatrix);
          std::__cxx11::string::~string((string *)&attribMatrix);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)local_3f0);
        }
        if ((local_418._0_4_ != 0.0) || (NAN(local_418._0_4_))) {
          poVar5 = std::operator<<((ostream *)poVar10," + ");
          de::floatToString_abi_cxx11_((string *)local_3f0,(de *)0x2,local_418._0_4_,precision);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"0.0",&local_429);
          twoValuedVec4((string *)&attribMatrix,(string *)local_3f0,&local_3b8,
                        (BVec4 *)(s_outSwizzleChannelMasks + lVar7 * 4));
          std::operator<<(poVar5,(string *)&attribMatrix);
          std::__cxx11::string::~string((string *)&attribMatrix);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)local_3f0);
        }
        std::operator<<((ostream *)poVar10,";\n");
      }
      if ((pSVar12->super_ShaderRenderCase).m_isVertexCase == false) {
        pcVar4 = "\to_color = color;\n";
        for (iVar3 = 0; pSVar12 = local_428, iVar3 < (local_428->m_spec).numInputs;
            iVar3 = iVar3 + 1) {
          poVar5 = std::operator<<((ostream *)&vtx,"\tv_in");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          poVar5 = std::operator<<(poVar5," = a_in");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          std::operator<<(poVar5,";\n");
        }
      }
      else {
        std::operator<<((ostream *)&vtx,"\tv_color = color;\n");
        pcVar4 = "\to_color = v_color;\n";
      }
      std::operator<<((ostream *)&frag,pcVar4);
      std::operator<<((ostream *)&vtx,"}\n");
      std::operator<<((ostream *)&frag,"}\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(pSVar12->super_ShaderRenderCase).m_vertShaderSource,
                 (string *)&attribMatrix);
      std::__cxx11::string::~string((string *)&attribMatrix);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(pSVar12->super_ShaderRenderCase).m_fragShaderSource,
                 (string *)&attribMatrix);
      std::__cxx11::string::~string((string *)&attribMatrix);
      local_3f8 = (FloatScalar *)&(pSVar12->super_ShaderRenderCase).m_userAttribTransforms;
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
                ((vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
                 local_3f8,(long)(pSVar12->m_spec).numInputs);
      lVar7 = 0;
      do {
        if ((local_428->m_spec).numInputs <= lVar7) {
          std::__cxx11::string::~string((string *)&prefix);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          return;
        }
        iVar3 = (*((local_428->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
        pSVar11 = local_3d0;
        fVar14 = FloatScalar::getValue
                           (&local_3d0[lVar7].rangeMin,(Functions *)CONCAT44(extraout_var_01,iVar3),
                            local_41c);
        iVar3 = (*((local_428->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
        fVar15 = FloatScalar::getValue
                           (&pSVar11[lVar7].rangeMax,(Functions *)CONCAT44(extraout_var_02,iVar3),
                            local_41c);
        local_418 = (ShaderValue *)CONCAT44(local_418._4_4_,fVar15);
        tcu::Matrix<float,_4,_4>::Matrix(&attribMatrix);
        local_3c8 = ZEXT416((uint)(local_418._0_4_ - fVar14));
        local_408 = (char *)CONCAT44(0x80000000,-(local_418._0_4_ - fVar14));
        uStack_400 = 0x80000000;
        uStack_3fc = 0x80000000;
        for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_3f0);
          switch((long)(iVar3 + (int)lVar7) % 4 & 0xffffffff) {
          case 0:
            local_3f0._0_4_ = local_3c8._0_4_;
            local_3f0._4_4_ = 0.0;
            local_3e4 = fVar14;
            break;
          case 1:
            local_3f0._0_4_ = 0.0;
            local_3f0._4_4_ = local_3c8._0_4_;
            local_3e4 = fVar14;
            break;
          case 2:
            local_3f0._0_4_ = (float)local_408;
            local_3f0._4_4_ = 0.0;
            goto LAB_00507c6d;
          case 3:
            local_3f0._0_4_ = 0.0;
            local_3f0._4_4_ = (float)local_408;
LAB_00507c6d:
            local_3e4 = local_418._0_4_;
            break;
          default:
            goto switchD_00507c41_default;
          }
          local_3e8 = 0.0;
switchD_00507c41_default:
          tcu::Matrix<float,_4,_4>::setRow(&attribMatrix,iVar3,(Vector<float,_4> *)local_3f0);
        }
        tcu::Matrix<float,_4,_4>::operator=
                  ((((_Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      *)&local_3f8->m_isConstant)->_M_impl).super__Vector_impl_data._M_start + lVar7
                   ,&attribMatrix);
        lVar7 = lVar7 + 1;
      } while( true );
    }
    DVar2 = local_418->type;
    iVar3 = glu::getDataTypeScalarSize(DVar2);
    pcVar6 = glu::getDataTypeName(DVar2);
    local_3c8._0_8_ = puVar9;
    pcVar4 = *(char **)(puVar9 + (long)(iVar3 + -1) * 8);
    std::operator<<((ostream *)poVar10,"\t");
    uVar1 = DVar2 - TYPE_BOOL;
    if (local_408 != (char *)0x0 && 3 < uVar1) {
      poVar5 = std::operator<<((ostream *)poVar10,local_408);
      std::operator<<(poVar5," ");
    }
    poVar5 = std::operator<<((ostream *)poVar10,pcVar6);
    poVar5 = std::operator<<(poVar5," in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
    std::operator<<(poVar5," = ");
    if (uVar1 < 4) {
      pcVar6 = "greaterThan(";
      poVar5 = (ostream *)poVar10;
      if (iVar3 == 1) {
        pcVar6 = "(";
      }
LAB_00507545:
      std::operator<<(poVar5,pcVar6);
    }
    else if (DVar2 - TYPE_INT < 8) {
      poVar5 = std::operator<<((ostream *)poVar10,pcVar6);
      pcVar6 = "(";
      goto LAB_00507545;
    }
    poVar5 = std::operator<<((ostream *)poVar10,(string *)&prefix);
    poVar5 = std::operator<<(poVar5,"in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
    poVar5 = std::operator<<(poVar5,".");
    std::operator<<(poVar5,pcVar4);
    poVar5 = (ostream *)poVar10;
    if (uVar1 < 4) {
      pcVar4 = " > 0.0)";
      if (iVar3 != 1) {
        poVar5 = std::operator<<((ostream *)poVar10,", vec");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        pcVar4 = "(0.0))";
      }
LAB_005075e3:
      std::operator<<(poVar5,pcVar4);
    }
    else {
      pcVar4 = ")";
      if (DVar2 - TYPE_INT < 8) goto LAB_005075e3;
    }
    std::operator<<((ostream *)poVar10,";\n");
    lVar7 = lVar7 + 1;
    puVar9 = (undefined1 *)(local_3c8._0_8_ + 0x20);
    local_418 = local_418 + 1;
  } while( true );
}

Assistant:

void ShaderOperatorCase::setupShaderData (void)
{
	ShaderType		shaderType	= m_isVertexCase ? SHADERTYPE_VERTEX : SHADERTYPE_FRAGMENT;
	const char*		precision	= m_spec.precision != PRECISION_LAST ? getPrecisionName(m_spec.precision) : DE_NULL;
	const char*		inputPrecision[MAX_INPUTS];

	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= m_isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	// Compute precision for inputs.
	for (int i = 0; i < m_spec.numInputs; i++)
	{
		bool		isBoolVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		bool		isIntVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_INT, TYPE_INT_VEC4);
		bool		isUintVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_UINT, TYPE_UINT_VEC4);
		// \note Mediump interpolators are used for booleans, and highp for integers.
		Precision	prec		= isBoolVal	? PRECISION_MEDIUMP
								: isIntVal || isUintVal ? PRECISION_HIGHP
								: m_spec.precision;
		inputPrecision[i] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "in highp vec4 a_position;\n";
	for (int i = 0; i < m_spec.numInputs; i++)
		vtx << "in " << inputPrecision[i] << " vec4 a_in" << i << ";\n";

	// Color output.
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < m_spec.numInputs; i++)
		{
			vtx << "out " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
			frag << "in " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	string prefix = m_isVertexCase ? "a_" : "v_";
	for (int i = 0; i < m_spec.numInputs; i++)
	{
		DataType		inType		= m_spec.inputs[i].type;
		int				inSize		= getDataTypeScalarSize(inType);
		bool			isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		bool			isUint		= de::inRange<int>(inType, TYPE_UINT, TYPE_UINT_VEC4);
		bool			isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[i][inSize-1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << i << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt || isUint)
			op << typeName << "(";

		op << prefix << "in" << i << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt || isUint)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(m_spec.output);
		bool		isBoolOut	= de::inRange<int>(m_spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << m_shaderOp << "\n\n";

	// Convert to color.
	bool	isResFloatVec	= de::inRange<int>(m_spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	int		outScalarSize	= getDataTypeScalarSize(m_spec.output);

	op << "\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	float	resultScale		= m_spec.resultScale.getValue(m_renderCtx.getFunctions(), shaderType);
	float	resultBias		= m_spec.resultBias.getValue(m_renderCtx.getFunctions(), shaderType);
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << twoValuedVec4(de::toString(resultScale),		"1.0", s_outSwizzleChannelMasks[outScalarSize-1]);
		if (resultBias != 0.0f)  op << " + " << twoValuedVec4(de::floatToString(resultBias, 2),	"0.0", s_outSwizzleChannelMasks[outScalarSize-1]);
		op << ";\n";
	}

	// ..
	if (m_isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		for (int i = 0; i < m_spec.numInputs; i++)
		vtx << "	v_in" << i << " = a_in" << i << ";\n";
		frag << "	o_color = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	// Setup the user attributes.
	m_userAttribTransforms.resize(m_spec.numInputs);
	for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
	{
		const ShaderValue& v = m_spec.inputs[inputNdx];
		DE_ASSERT(v.type != TYPE_LAST);

		float rangeMin	= v.rangeMin.getValue(m_renderCtx.getFunctions(), shaderType);
		float rangeMax	= v.rangeMax.getValue(m_renderCtx.getFunctions(), shaderType);
		float scale		= rangeMax - rangeMin;
		float minBias	= rangeMin;
		float maxBias	= rangeMax;
		Mat4  attribMatrix;

		for (int rowNdx = 0; rowNdx < 4; rowNdx++)
		{
			Vec4 row;

			switch ((rowNdx + inputNdx) % 4)
			{
				case 0:	row = Vec4(scale, 0.0f, 0.0f, minBias);		break;
				case 1:	row = Vec4(0.0f, scale, 0.0f, minBias);		break;
				case 2:	row = Vec4(-scale, 0.0f, 0.0f, maxBias);	break;
				case 3:	row = Vec4(0.0f, -scale, 0.0f, maxBias);	break;
				default: DE_ASSERT(false);
			}

			attribMatrix.setRow(rowNdx, row);
		}

		m_userAttribTransforms[inputNdx] = attribMatrix;
	}
}